

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decodeColorEndpointModes
               (deUint32 *endpointModesDst,Block128 *blockData,int numPartitions,
               int extraCemBitsStart)

{
  bool bVar1;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  int local_64;
  int local_58;
  deUint32 lowBit1;
  deUint32 lowBit0;
  deUint32 lowBit1Ndx;
  deUint32 lowBit0Ndx;
  deUint32 cemClass;
  int partNdx;
  int i;
  deUint32 mode;
  deUint32 highLevelSelector;
  int extraCemBitsStart_local;
  int numPartitions_local;
  Block128 *blockData_local;
  deUint32 *endpointModesDst_local;
  
  if (numPartitions == 1) {
    dVar2 = Block128::getBits(blockData,0xd,0x10);
    *endpointModesDst = dVar2;
  }
  else {
    dVar2 = Block128::getBits(blockData,0x17,0x18);
    if (dVar2 == 0) {
      dVar2 = Block128::getBits(blockData,0x19,0x1c);
      for (cemClass = 0; (int)cemClass < numPartitions; cemClass = cemClass + 1) {
        endpointModesDst[(int)cemClass] = dVar2;
      }
    }
    else {
      for (lowBit0Ndx = 0; (int)lowBit0Ndx < numPartitions; lowBit0Ndx = lowBit0Ndx + 1) {
        bVar1 = Block128::isBitSet(blockData,lowBit0Ndx + 0x19);
        uVar3 = numPartitions + lowBit0Ndx * 2;
        local_64 = numPartitions + lowBit0Ndx * 2;
        uVar4 = local_64 + 1;
        if (uVar3 < 4) {
          local_58 = uVar3 + 0x19;
        }
        else {
          local_58 = extraCemBitsStart + uVar3 + -4;
        }
        dVar5 = Block128::getBit(blockData,local_58);
        if (uVar4 < 4) {
          local_64 = local_64 + 0x1a;
        }
        else {
          local_64 = extraCemBitsStart + uVar4 + -4;
        }
        dVar6 = Block128::getBit(blockData,local_64);
        endpointModesDst[(int)lowBit0Ndx] = (dVar2 - !bVar1) * 4 | dVar6 << 1 | dVar5;
      }
    }
  }
  return;
}

Assistant:

void decodeColorEndpointModes (deUint32* endpointModesDst, const Block128& blockData, int numPartitions, int extraCemBitsStart)
{
	if (numPartitions == 1)
		endpointModesDst[0] = blockData.getBits(13, 16);
	else
	{
		const deUint32 highLevelSelector = blockData.getBits(23, 24);

		if (highLevelSelector == 0)
		{
			const deUint32 mode = blockData.getBits(25, 28);
			for (int i = 0; i < numPartitions; i++)
				endpointModesDst[i] = mode;
		}
		else
		{
			for (int partNdx = 0; partNdx < numPartitions; partNdx++)
			{
				const deUint32 cemClass		= highLevelSelector - (blockData.isBitSet(25 + partNdx) ? 0 : 1);
				const deUint32 lowBit0Ndx	= numPartitions + 2*partNdx;
				const deUint32 lowBit1Ndx	= numPartitions + 2*partNdx + 1;
				const deUint32 lowBit0		= blockData.getBit(lowBit0Ndx < 4 ? 25+lowBit0Ndx : extraCemBitsStart+lowBit0Ndx-4);
				const deUint32 lowBit1		= blockData.getBit(lowBit1Ndx < 4 ? 25+lowBit1Ndx : extraCemBitsStart+lowBit1Ndx-4);

				endpointModesDst[partNdx] = (cemClass << 2) | (lowBit1 << 1) | lowBit0;
			}
		}
	}
}